

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendOperator(ScriptBuilder *this,ScriptOperator *operate_object)

{
  undefined1 local_9;
  
  local_9 = (undefined1)operate_object->data_type_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->script_byte_array_,&local_9);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendOperator(
    const ScriptOperator& operate_object) {
  script_byte_array_.push_back(
      static_cast<uint8_t>(operate_object.GetDataType()));
  return *this;
}